

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O2

bool spvParseVulkanEnv(uint32_t vulkan_ver,uint32_t spirv_ver,spv_target_env_conflict *env)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    if (lVar1 == 0x50) {
LAB_00515cef:
      return lVar1 != 0x50;
    }
    if ((vulkan_ver <= *(uint *)(&UNK_007c370c + lVar1)) &&
       (spirv_ver <= *(uint *)((long)&ordered_vulkan_envs[0].vulkan_env + lVar1))) {
      *env = *(spv_target_env_conflict *)((long)ordered_universal_envs._M_elems + lVar1 + 0x18);
      goto LAB_00515cef;
    }
    lVar1 = lVar1 + 0xc;
  } while( true );
}

Assistant:

bool spvParseVulkanEnv(uint32_t vulkan_ver, uint32_t spirv_ver,
                       spv_target_env* env) {
  for (auto triple : ordered_vulkan_envs) {
    if (triple.vulkan_ver >= vulkan_ver && triple.spirv_ver >= spirv_ver) {
      *env = triple.vulkan_env;
      return true;
    }
  }
  return false;
}